

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O2

size_t nghttp2_bufs_len(nghttp2_bufs *bufs)

{
  uint8_t *puVar1;
  
  puVar1 = (uint8_t *)0x0;
  while (bufs = (nghttp2_bufs *)bufs->head, bufs != (nghttp2_bufs *)0x0) {
    puVar1 = (uint8_t *)bufs->max_chunk + ((long)puVar1 - (long)bufs->chunk_length);
  }
  return (size_t)puVar1;
}

Assistant:

size_t nghttp2_bufs_len(nghttp2_bufs *bufs) {
  nghttp2_buf_chain *ci;
  size_t len;

  len = 0;
  for (ci = bufs->head; ci; ci = ci->next) {
    len += nghttp2_buf_len(&ci->buf);
  }

  return len;
}